

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_meta.cc
# Opt level: O2

void SelectiveBranchingMT::run(search *sch,multi_ex *ec)

{
  v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *this;
  v_array<std::pair<unsigned_int,_float>_> *this_00;
  ulong *puVar1;
  pair<float,_v_array<std::pair<unsigned_int,_float>_>_> *__seed;
  pair<float,_v_array<std::pair<unsigned_int,_float>_>_> *ppVar2;
  pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *__seed_00;
  pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *ppVar3;
  string *this_01;
  ulong uVar4;
  stringstream *this_02;
  ulong uVar5;
  ostream *poVar6;
  size_t i_3;
  long lVar7;
  long lVar8;
  size_t i;
  ulong uVar9;
  size_t i_2;
  _TmpBuf __buf;
  undefined4 local_78;
  undefined4 uStack_74;
  uint uStack_70;
  undefined4 uStack_6c;
  path original_final;
  
  puVar1 = (ulong *)sch->metatask_data;
  v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_>::clear
            ((v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_> *)(puVar1 + 2));
  this = (v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
          *)(puVar1 + 6);
  v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::clear(this);
  this_00 = (v_array<std::pair<unsigned_int,_float>_> *)(puVar1 + 10);
  v_array<std::pair<unsigned_int,_float>_>::clear(this_00);
  *(undefined4 *)(puVar1 + 0xe) = 0;
  puVar1[0x10] = 0;
  __buf._M_buffer._0_4_ = (uint)__buf._M_buffer & 0xffffff00;
  __buf._M_original_len = (size_type_conflict)sch;
  __buf._M_len = (size_type_conflict)ec;
  Search::BaseTask::Run((BaseTask *)&__buf);
  original_final.end_array = (pair<unsigned_int,_float> *)0x0;
  original_final.erase_count = 0;
  original_final._begin = (pair<unsigned_int,_float> *)0x0;
  original_final._end = (pair<unsigned_int,_float> *)0x0;
  copy_array<std::pair<unsigned_int,float>>(&original_final,this_00);
  __buf._M_original_len._0_4_ = (undefined4)puVar1[0xe];
  local_78 = SUB84(original_final._begin,0);
  uStack_74 = (undefined4)((ulong)original_final._begin >> 0x20);
  uStack_70 = (uint)original_final._end;
  uStack_6c = (undefined4)((ulong)original_final._end >> 0x20);
  __buf._M_len._0_4_ = local_78;
  __buf._M_len._4_4_ = uStack_74;
  __buf._M_buffer._0_4_ = uStack_70;
  __buf._M_buffer._4_4_ = uStack_6c;
  v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::push_back(this,(pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                    *)&__buf);
  __seed = (pair<float,_v_array<std::pair<unsigned_int,_float>_>_> *)puVar1[2];
  ppVar2 = (pair<float,_v_array<std::pair<unsigned_int,_float>_>_> *)puVar1[3];
  lVar8 = 0x28;
  if (__seed != ppVar2) {
    std::
    _Temporary_buffer<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_*,_std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_>
    ::_Temporary_buffer(&__buf,__seed,(((long)ppVar2 - (long)__seed) / 0x28 + 1) / 2);
    if (CONCAT44(__buf._M_buffer._4_4_,(uint)__buf._M_buffer) == 0) {
      std::
      __inplace_stable_sort<std::pair<float,v_array<std::pair<unsigned_int,float>>>*,__gnu_cxx::__ops::_Iter_comp_iter<SelectiveBranchingMT::run(Search::search&,std::vector<example*,std::allocator<example*>>&)::__3>>
                (__seed,ppVar2);
    }
    else {
      std::
      __stable_sort_adaptive<std::pair<float,v_array<std::pair<unsigned_int,float>>>*,std::pair<float,v_array<std::pair<unsigned_int,float>>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<SelectiveBranchingMT::run(Search::search&,std::vector<example*,std::allocator<example*>>&)::__3>>
                (__seed,ppVar2,CONCAT44(__buf._M_buffer._4_4_,(uint)__buf._M_buffer),
                 CONCAT44(__buf._M_len._4_4_,(undefined4)__buf._M_len));
    }
    operator_delete((void *)CONCAT44(__buf._M_buffer._4_4_,(uint)__buf._M_buffer));
  }
  uVar9 = 0;
  while( true ) {
    uVar4 = (long)(puVar1[3] - puVar1[2]) / 0x28;
    if (*puVar1 < uVar4) {
      uVar4 = *puVar1;
    }
    if (uVar4 <= uVar9) break;
    puVar1[0xf] = uVar9;
    v_array<std::pair<unsigned_int,_float>_>::clear(this_00);
    *(undefined4 *)(puVar1 + 0xe) = 0;
    puVar1[0x10] = 0;
    __buf._M_buffer._0_4_ = (uint)__buf._M_buffer & 0xffffff00;
    __buf._M_original_len = (size_type_conflict)sch;
    __buf._M_len = (size_type_conflict)ec;
    Search::BaseTask::Run((BaseTask *)&__buf);
    original_final.end_array = (pair<unsigned_int,_float> *)0x0;
    original_final.erase_count = 0;
    original_final._begin = (pair<unsigned_int,_float> *)0x0;
    original_final._end = (pair<unsigned_int,_float> *)0x0;
    copy_array<std::pair<unsigned_int,float>>(&original_final,this_00);
    __buf._M_original_len._0_4_ = (undefined4)puVar1[0xe];
    local_78 = SUB84(original_final._begin,0);
    uStack_74 = (undefined4)((ulong)original_final._begin >> 0x20);
    uStack_70 = (uint)original_final._end;
    uStack_6c = (undefined4)((ulong)original_final._end >> 0x20);
    __buf._M_buffer._4_4_ = uStack_6c;
    __buf._M_len._0_4_ = local_78;
    __buf._M_len._4_4_ = uStack_74;
    __buf._M_buffer._0_4_ = uStack_70;
    v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ::push_back(this,(pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                      *)&__buf);
    uVar9 = uVar9 + 1;
  }
  __seed_00 = (pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
               *)puVar1[6];
  ppVar3 = (pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
            *)puVar1[7];
  if (__seed_00 != ppVar3) {
    std::
    _Temporary_buffer<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_*,_std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ::_Temporary_buffer((_Temporary_buffer<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_*,_std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                         *)&__buf,__seed_00,(((long)ppVar3 - (long)__seed_00) / 0x30 + 1) / 2);
    if (CONCAT44(__buf._M_buffer._4_4_,(uint)__buf._M_buffer) == 0) {
      std::
      __inplace_stable_sort<std::pair<std::pair<float,v_array<std::pair<unsigned_int,float>>>,std::__cxx11::string*>*,__gnu_cxx::__ops::_Iter_comp_iter<SelectiveBranchingMT::run(Search::search&,std::vector<example*,std::allocator<example*>>&)::__8>>
                (__seed_00,ppVar3);
    }
    else {
      std::
      __stable_sort_adaptive<std::pair<std::pair<float,v_array<std::pair<unsigned_int,float>>>,std::__cxx11::string*>*,std::pair<std::pair<float,v_array<std::pair<unsigned_int,float>>>,std::__cxx11::string*>*,long,__gnu_cxx::__ops::_Iter_comp_iter<SelectiveBranchingMT::run(Search::search&,std::vector<example*,std::allocator<example*>>&)::__8>>
                (__seed_00,ppVar3,CONCAT44(__buf._M_buffer._4_4_,(uint)__buf._M_buffer),
                 CONCAT44(__buf._M_len._4_4_,(undefined4)__buf._M_len));
    }
    operator_delete((void *)CONCAT44(__buf._M_buffer._4_4_,(uint)__buf._M_buffer));
  }
  puVar1[0x11] = 0;
  if ((puVar1[0x10] != 0) && (puVar1[1] != 0)) {
    this_02 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(this_02);
    puVar1[0x11] = (ulong)this_02;
    lVar7 = 0;
    uVar9 = 0;
    while( true ) {
      uVar5 = (long)(puVar1[7] - puVar1[6]) / 0x30;
      uVar4 = puVar1[1];
      if (uVar5 < puVar1[1]) {
        uVar4 = uVar5;
      }
      if (uVar4 <= uVar9) break;
      poVar6 = std::operator<<((ostream *)(puVar1[0x11] + 0x10),
                               *(string **)(puVar1[6] + 0x28 + lVar7));
      poVar6 = std::operator<<(poVar6,"\t");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(float *)(puVar1[6] + lVar7));
      std::endl<char,std::char_traits<char>>(poVar6);
      uVar9 = uVar9 + 1;
      lVar7 = lVar7 + 0x30;
    }
  }
  puVar1[0xf] = 0;
  puVar1[0x10] = 0;
  __buf._M_buffer._0_1_ = 1;
  __buf._M_original_len = (size_type_conflict)sch;
  __buf._M_len = (size_type_conflict)ec;
  Search::BaseTask::Run((BaseTask *)&__buf);
  lVar7 = 8;
  for (uVar9 = 0; uVar9 < (ulong)((long)(puVar1[3] - puVar1[2]) / 0x28); uVar9 = uVar9 + 1) {
    v_array<std::pair<unsigned_int,_float>_>::delete_v
              ((v_array<std::pair<unsigned_int,_float>_> *)(puVar1[2] + lVar7));
    lVar7 = lVar7 + 0x28;
  }
  v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_>::clear
            ((v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_> *)(puVar1 + 2));
  for (uVar9 = 0; uVar9 < (ulong)((long)(puVar1[7] - puVar1[6]) / 0x30); uVar9 = uVar9 + 1) {
    v_array<std::pair<unsigned_int,_float>_>::delete_v
              ((v_array<std::pair<unsigned_int,_float>_> *)(puVar1[6] + lVar8 + -0x20));
    this_01 = *(string **)((long)&(this->_begin->first).first + lVar8);
    if (this_01 != (string *)0x0) {
      std::__cxx11::string::~string(this_01);
    }
    operator_delete(this_01);
    lVar8 = lVar8 + 0x30;
  }
  v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::clear(this);
  if ((long *)puVar1[0x11] != (long *)0x0) {
    (**(code **)(*(long *)puVar1[0x11] + 8))();
  }
  puVar1[0x11] = 0;
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data& d = *sch.get_metatask_data<task_data>();

  // generate an initial trajectory, but record possible branches
  d.branches.clear();
  d.final.clear();
  d.trajectory.clear();
  d.total_cost = 0.;
  d.output_string = nullptr;

  cdbg << "*** INITIAL PASS ***" << endl;
  sch.base_task(ec)
      .foreach_action([](Search::search& sch, size_t t, float min_cost, action a, bool taken, float a_cost) -> void {
        cdbg << "==DebugMT== foreach_action(t=" << t << ", min_cost=" << min_cost << ", a=" << a << ", taken=" << taken
             << ", a_cost=" << a_cost << ")" << endl;
        if (taken)
          return;  // ignore the taken action
        task_data& d = *sch.get_metatask_data<task_data>();
        float delta = a_cost - min_cost;
        path branch = v_init<act_score>();
        push_many<act_score>(branch, d.trajectory.begin(), d.trajectory.size());
        branch.push_back(make_pair(a, a_cost));
        d.branches.push_back(make_pair(delta, branch));
        cdbg << "adding branch: " << delta << " -> " << branch << endl;
      })
      .post_prediction([](Search::search& sch, size_t /*t*/, action a, float a_cost) -> void {
        task_data& d = *sch.get_metatask_data<task_data>();
        d.trajectory.push_back(make_pair(a, a_cost));
        d.total_cost += a_cost;
      })
      .with_output_string([](Search::search& sch, stringstream& output) -> void {
        sch.get_metatask_data<task_data>()->output_string = new string(output.str());
      })
      .Run();

  // the last item the trajectory stack is complete and therefore not a branch
  // if (! d.branches.empty())
  //  d.branches.pop().second.delete_v();

  {
    // construct the final trajectory
    path original_final = v_init<act_score>();
    copy_array(original_final, d.trajectory);
    d.final.push_back(make_pair(make_pair(d.total_cost, original_final), d.output_string));
  }

  // sort the branches by cost
  stable_sort(
      d.branches.begin(), d.branches.end(), [](const branch& a, const branch& b) -> bool { return a.first < b.first; });

  // make new predictions
  for (size_t i = 0; i < min(d.max_branches, d.branches.size()); i++)
  {
    d.cur_branch = i;
    d.trajectory.clear();
    d.total_cost = 0.;
    d.output_string = nullptr;

    cdbg << "*** BRANCH " << i << " *** " << d.branches[i].first << " : " << d.branches[i].second << endl;
    sch.base_task(ec)
        .foreach_action([](Search::search& /*sch*/, size_t /*t*/, float /*min_cost*/, action /*a*/, bool /*taken*/,
                            float /*a_cost*/) -> void {})
        .maybe_override_prediction([](Search::search& sch, size_t t, action& a, float& a_cost) -> bool {
          task_data& d = *sch.get_metatask_data<task_data>();
          path& path = d.branches[d.cur_branch].second;
          if (t >= path.size())
            return false;
          a = path[t].first;
          a_cost = path[t].second;
          return true;
        })
        .post_prediction([](Search::search& sch, size_t /*t*/, action a, float a_cost) -> void {
          task_data& d = *sch.get_metatask_data<task_data>();
          d.trajectory.push_back(make_pair(a, a_cost));
          d.total_cost += a_cost;
        })
        .with_output_string([](Search::search& sch, stringstream& output) -> void {
          sch.get_metatask_data<task_data>()->output_string = new string(output.str());
        })
        .Run();

    {
      // construct the final trajectory
      path this_final = v_init<act_score>();
      copy_array(this_final, d.trajectory);
      d.final.push_back(make_pair(make_pair(d.total_cost, this_final), d.output_string));
    }
  }

  // sort the finals by cost
  stable_sort(
      d.final.begin(), d.final.end(), [](const pair<branch, string*>& a, const pair<branch, string*>& b) -> bool {
        return a.first.first < b.first.first;
      });

  d.kbest_out = nullptr;
  if (d.output_string && (d.kbest > 0))
  {
    d.kbest_out = new stringstream();
    for (size_t i = 0; i < min(d.final.size(), d.kbest); i++)
      (*d.kbest_out) << *d.final[i].second << "\t" << d.final[i].first.first << endl;
  }

  // run the final selected trajectory
  cdbg << "*** FINAL ***" << endl;
  d.cur_branch = 0;
  d.output_string = nullptr;
  sch.base_task(ec)
      .foreach_action([](Search::search& /*sch*/, size_t /*t*/, float /*min_cost*/, action /*a*/, bool /*taken*/,
                          float /*a_cost*/) -> void {})
      .maybe_override_prediction([](Search::search& sch, size_t t, action& a, float& a_cost) -> bool {
        task_data& d = *sch.get_metatask_data<task_data>();
        path& path = d.final[d.cur_branch].first.second;
        if ((t >= path.size()) || (path[t].first == (action)-1))
          return false;
        a = path[t].first;
        a_cost = path[t].second;
        return true;
      })
      .with_output_string([](Search::search& sch, stringstream& output) -> void {
        task_data& d = *sch.get_metatask_data<task_data>();
        if (d.kbest_out)
        {
          output.str("");
          output << d.kbest_out->str();
        }
      })
      .final_run()
      .Run();

  // clean up memory
  for (size_t i = 0; i < d.branches.size(); i++) d.branches[i].second.delete_v();
  d.branches.clear();
  for (size_t i = 0; i < d.final.size(); i++)
  {
    d.final[i].first.second.delete_v();
    delete d.final[i].second;
  }
  d.final.clear();
  if (d.kbest_out)
    delete d.kbest_out;
  d.kbest_out = nullptr;
}